

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_zip.cpp
# Opt level: O1

bool __thiscall FZipFile::Open(FZipFile *this,bool quiet)

{
  long lVar1;
  undefined8 *puVar2;
  ushort uVar3;
  FileReader *pFVar4;
  FZipLump *this_00;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar7;
  ulong *puVar8;
  void *pvVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  char *format;
  uint uVar13;
  size_t __size;
  void *pvVar14;
  uint uVar15;
  bool bVar16;
  bool bVar17;
  FString name;
  FZipEndOfCentralDirectory info;
  int local_46c;
  FString local_460;
  void *local_458;
  void *local_450;
  FZipLump *local_448;
  FString local_440;
  char local_438 [4];
  short local_434;
  short local_432;
  ushort local_430;
  ushort local_42e;
  int local_42c;
  uint local_428;
  
  pFVar4 = (this->super_FResourceFile).Reader;
  local_458 = (void *)0x0;
  (*(pFVar4->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar4,0,2);
  uVar5 = (*(pFVar4->super_FileReaderBase)._vptr_FileReaderBase[3])(pFVar4);
  uVar15 = 0xffff;
  if (uVar5 < 0xffff) {
    uVar15 = uVar5;
  }
  local_450 = (void *)CONCAT44(local_450._4_4_,uVar5 - 4);
  uVar13 = 4;
  do {
    if (uVar15 <= uVar13) break;
    uVar13 = uVar13 + 0x400;
    if (uVar15 <= uVar13) {
      uVar13 = uVar15;
    }
    uVar11 = 0x404;
    if (uVar13 < 0x404) {
      uVar11 = (ulong)uVar13;
    }
    bVar17 = false;
    iVar6 = (*(pFVar4->super_FileReaderBase)._vptr_FileReaderBase[4])
                      (pFVar4,(ulong)(uVar5 - uVar13),0);
    if (CONCAT44(extraout_var,iVar6) == 0) {
      iVar6 = (*(pFVar4->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar4,local_438,uVar11);
      if (CONCAT44(extraout_var_00,iVar6) == uVar11) {
        if (3 < uVar5) {
          uVar10 = (ulong)((int)uVar11 - 3);
          lVar7 = 0;
          do {
            if ((((local_438[lVar7 + uVar11 + -4] == 'P') && (local_438[lVar7 + uVar10] == 'K')) &&
                (local_438[lVar7 + uVar10 + 1] == '\x05')) &&
               (local_438[lVar7 + uVar10 + 2] == '\x06')) {
              local_458 = (void *)(ulong)((int)lVar7 + (((int)uVar11 + (int)local_450) - uVar13));
              break;
            }
            lVar1 = lVar7 + (uVar11 - 3);
            lVar7 = lVar7 + -1;
          } while (lVar1 != 1 && -1 < lVar1 + -1);
        }
        bVar17 = (int)local_458 == 0;
      }
      else {
        bVar17 = false;
      }
    }
  } while (bVar17);
  this->Lumps = (FZipLump *)0x0;
  if ((int)local_458 == 0) {
    if (!quiet) {
      pcVar12 = (this->super_FResourceFile).Filename;
      format = "\x1cG\n%s: ZIP file corrupt!\n";
      goto LAB_004d6c5b;
    }
  }
  else {
    pFVar4 = (this->super_FResourceFile).Reader;
    (*(pFVar4->super_FileReaderBase)._vptr_FileReaderBase[4])
              (pFVar4,(ulong)local_458 & 0xffffffff,0);
    pFVar4 = (this->super_FResourceFile).Reader;
    (*(pFVar4->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar4,local_438,0x16);
    if (((local_430 == local_42e) && (local_432 == 0)) && (local_434 == 0)) {
      (this->super_FResourceFile).NumLumps = (uint)local_430;
      puVar8 = (ulong *)operator_new__((ulong)local_430 * 0x60 + 8);
      *puVar8 = (ulong)local_430;
      if (local_430 != 0) {
        lVar7 = 0;
        do {
          *(undefined8 *)((long)puVar8 + lVar7 + 0x18) = 0x727dbc;
          FString::NullString.RefCount = FString::NullString.RefCount + 1;
          *(undefined2 *)((long)puVar8 + lVar7 + 0x30) = 0;
          *(undefined1 *)((long)puVar8 + lVar7 + 0x20) = 0;
          puVar2 = (undefined8 *)((long)puVar8 + lVar7 + 0x38);
          *puVar2 = 0;
          puVar2[1] = 0;
          puVar2 = (undefined8 *)((long)puVar8 + lVar7 + 0x44);
          *puVar2 = 0;
          puVar2[1] = 0;
          *(undefined ***)
           ((long)&(((FZipLump *)(puVar8 + 1))->super_FResourceLump)._vptr_FResourceLump + lVar7) =
               &PTR__FResourceLump_0070d4f8;
          lVar7 = lVar7 + 0x60;
        } while ((ulong)local_430 * 0x60 != lVar7);
      }
      this->Lumps = (FZipLump *)(puVar8 + 1);
      __size = (size_t)local_42c;
      pvVar9 = malloc(__size);
      pFVar4 = (this->super_FResourceFile).Reader;
      (*(pFVar4->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar4,(ulong)local_428,0);
      pFVar4 = (this->super_FResourceFile).Reader;
      (*(pFVar4->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar4,pvVar9,__size);
      bVar17 = (this->super_FResourceFile).NumLumps == 0;
      local_450 = pvVar9;
      if (bVar17) {
        local_46c = 0;
      }
      else {
        local_448 = this->Lumps;
        local_458 = (void *)((long)pvVar9 + __size);
        local_46c = 0;
        uVar15 = 0;
        do {
          uVar3 = *(ushort *)((long)pvVar9 + 0x1c);
          FString::FString(&local_460,(char *)((long)pvVar9 + 0x2e),(ulong)uVar3);
          pvVar14 = (void *)((long)pvVar9 +
                            (ulong)*(ushort *)((long)pvVar9 + 0x20) +
                            (ulong)*(ushort *)((long)pvVar9 + 0x1e) +
                            (ulong)*(ushort *)((long)pvVar9 + 0x1c) + 0x2e);
          if (local_458 < pvVar14) {
            free(local_450);
            bVar16 = true;
            if (!quiet) {
              Printf("\x1cG\n%s: Central directory corrupted.",(this->super_FResourceFile).Filename)
              ;
            }
          }
          else if ((local_460.Chars[(ulong)uVar3 - 1] == '/') &&
                  (*(int *)((long)pvVar9 + 0x18) == 0)) {
            local_46c = local_46c + 1;
            bVar16 = false;
          }
          else {
            if ((*(ushort *)((long)pvVar9 + 10) < 0xf) &&
               ((0x5143U >> (*(ushort *)((long)pvVar9 + 10) & 0x1f) & 1) != 0)) {
              if ((*(byte *)((long)pvVar9 + 8) & 1) == 0) {
                FString::ReplaceChars(&local_460,'\\','/');
                FString::ToLower(&local_460);
                FString::AttachToOther(&local_440,&local_460);
                this_00 = local_448;
                FResourceLump::LumpNameSetup(&local_448->super_FResourceLump,&local_440);
                FString::~FString(&local_440);
                (this_00->super_FResourceLump).LumpSize = *(int *)((long)pvVar9 + 0x18);
                (this_00->super_FResourceLump).Owner = &this->super_FResourceFile;
                (this_00->super_FResourceLump).Flags = 0x82;
                (this_00->super_FResourceLump).field_0x4e = *(undefined1 *)((long)pvVar9 + 10);
                *(undefined2 *)&(this_00->super_FResourceLump).field_0x4c =
                     *(undefined2 *)((long)pvVar9 + 8);
                this_00->CRC32 = *(uint *)((long)pvVar9 + 0x10);
                this_00->CompressedSize = *(int *)((long)pvVar9 + 0x14);
                this_00->Position = *(int *)((long)pvVar9 + 0x2a);
                FResourceLump::CheckEmbedded(&this_00->super_FResourceLump);
                iVar6 = strcasecmp("dehacked.exe",local_460.Chars);
                if (iVar6 == 0) {
                  (local_448->super_FResourceLump).field_3.Name[8] = '\0';
                  (local_448->super_FResourceLump).field_3.qwName = 0;
                }
                local_448 = local_448 + 1;
                bVar16 = false;
                goto LAB_004d6c04;
              }
              if (!quiet) {
                Printf("\x1cK\n%s: \'%s\' is encrypted. Encryption is not supported.\n",
                       (this->super_FResourceFile).Filename);
              }
            }
            else if (!quiet) {
              Printf("\x1cK\n%s: \'%s\' uses an unsupported compression algorithm (#%d).\n",
                     (this->super_FResourceFile).Filename);
            }
            local_46c = local_46c + 1;
            bVar16 = false;
          }
LAB_004d6c04:
          FString::~FString(&local_460);
          if (bVar16) break;
          uVar15 = uVar15 + 1;
          bVar16 = uVar15 < (this->super_FResourceFile).NumLumps;
          bVar17 = !bVar16;
          pvVar9 = pvVar14;
        } while (bVar16);
      }
      if (!bVar17) {
        return bVar17;
      }
      uVar15 = (this->super_FResourceFile).NumLumps - local_46c;
      (this->super_FResourceFile).NumLumps = uVar15;
      free(local_450);
      if ((!quiet) && (batchrun == false)) {
        Printf("\x1c-, %d lumps\n",(ulong)uVar15);
      }
      FResourceFile::PostProcessArchive(&this->super_FResourceFile,this->Lumps,0x60);
      return true;
    }
    if (!quiet) {
      pcVar12 = (this->super_FResourceFile).Filename;
      format = "\x1cG\n%s: Multipart Zip files are not supported.\n";
LAB_004d6c5b:
      Printf(format,pcVar12);
      return false;
    }
  }
  return false;
}

Assistant:

bool FZipFile::Open(bool quiet)
{
	DWORD centraldir = Zip_FindCentralDir(Reader);
	FZipEndOfCentralDirectory info;
	int skipped = 0;

	Lumps = NULL;

	if (centraldir == 0)
	{
		if (!quiet) Printf(TEXTCOLOR_RED "\n%s: ZIP file corrupt!\n", Filename);
		return false;
	}

	// Read the central directory info.
	Reader->Seek(centraldir, SEEK_SET);
	Reader->Read(&info, sizeof(FZipEndOfCentralDirectory));

	// No multi-disk zips!
	if (info.NumEntries != info.NumEntriesOnAllDisks ||
		info.FirstDisk != 0 || info.DiskNumber != 0)
	{
		if (!quiet) Printf(TEXTCOLOR_RED "\n%s: Multipart Zip files are not supported.\n", Filename);
		return false;
	}

	NumLumps = LittleShort(info.NumEntries);
	Lumps = new FZipLump[NumLumps];

	// Load the entire central directory. Too bad that this contains variable length entries...
	int dirsize = LittleLong(info.DirectorySize);
	void *directory = malloc(dirsize);
	Reader->Seek(LittleLong(info.DirectoryOffset), SEEK_SET);
	Reader->Read(directory, dirsize);

	char *dirptr = (char*)directory;
	FZipLump *lump_p = Lumps;
	for (DWORD i = 0; i < NumLumps; i++)
	{
		FZipCentralDirectoryInfo *zip_fh = (FZipCentralDirectoryInfo *)dirptr;

		int len = LittleShort(zip_fh->NameLength);
		FString name(dirptr + sizeof(FZipCentralDirectoryInfo), len);
		dirptr += sizeof(FZipCentralDirectoryInfo) + 
				  LittleShort(zip_fh->NameLength) + 
				  LittleShort(zip_fh->ExtraLength) + 
				  LittleShort(zip_fh->CommentLength);

		if (dirptr > ((char*)directory) + dirsize)	// This directory entry goes beyond the end of the file.
		{
			free(directory);
			if (!quiet) Printf(TEXTCOLOR_RED "\n%s: Central directory corrupted.", Filename);
			return false;
		}
		
		// skip Directories
		if (name[len - 1] == '/' && LittleLong(zip_fh->UncompressedSize) == 0) 
		{
			skipped++;
			continue;
		}

		// Ignore unknown compression formats
		zip_fh->Method = LittleShort(zip_fh->Method);
		if (zip_fh->Method != METHOD_STORED &&
			zip_fh->Method != METHOD_DEFLATE &&
			zip_fh->Method != METHOD_LZMA &&
			zip_fh->Method != METHOD_BZIP2 &&
			zip_fh->Method != METHOD_IMPLODE &&
			zip_fh->Method != METHOD_SHRINK)
		{
			if (!quiet) Printf(TEXTCOLOR_YELLOW "\n%s: '%s' uses an unsupported compression algorithm (#%d).\n", Filename, name.GetChars(), zip_fh->Method);
			skipped++;
			continue;
		}
		// Also ignore encrypted entries
		zip_fh->Flags = LittleShort(zip_fh->Flags);
		if (zip_fh->Flags & ZF_ENCRYPTED)
		{
			if (!quiet) Printf(TEXTCOLOR_YELLOW "\n%s: '%s' is encrypted. Encryption is not supported.\n", Filename, name.GetChars());
			skipped++;
			continue;
		}

		FixPathSeperator(name);
		name.ToLower();

		lump_p->LumpNameSetup(name);
		lump_p->LumpSize = LittleLong(zip_fh->UncompressedSize);
		lump_p->Owner = this;
		// The start of the Reader will be determined the first time it is accessed.
		lump_p->Flags = LUMPF_ZIPFILE | LUMPFZIP_NEEDFILESTART;
		lump_p->Method = BYTE(zip_fh->Method);
		lump_p->GPFlags = zip_fh->Flags;
		lump_p->CRC32 = zip_fh->CRC32;
		lump_p->CompressedSize = LittleLong(zip_fh->CompressedSize);
		lump_p->Position = LittleLong(zip_fh->LocalHeaderOffset);
		lump_p->CheckEmbedded();

		// Ignore some very specific names
		if (0 == stricmp("dehacked.exe", name))
		{
			memset(lump_p->Name, 0, sizeof(lump_p->Name));
		}

		lump_p++;
	}
	// Resize the lump record array to its actual size
	NumLumps -= skipped;
	free(directory);

	if (!quiet && !batchrun) Printf(TEXTCOLOR_NORMAL ", %d lumps\n", NumLumps);
	
	PostProcessArchive(&Lumps[0], sizeof(FZipLump));
	return true;
}